

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *vidx,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *rhs,int *ridx,int rn,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  int iVar12;
  uint uVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  uint uVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  int iVar17;
  long lVar18;
  int *piVar19;
  uint uVar20;
  double a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_248;
  int *local_210;
  cpp_dec_float<50U,_int,_void> local_208;
  ulong local_1d0;
  ulong local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  int *local_180;
  pointer local_178;
  int *local_170;
  int *local_168;
  int *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  int *local_150;
  int *local_148;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_140;
  int *local_138;
  long local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  ulong uVar21;
  
  local_208.fpclass = cpp_dec_float_finite;
  local_208.prec_elem = 10;
  local_208.data._M_elems[0] = 0;
  local_208.data._M_elems[1] = 0;
  local_208.data._M_elems[2] = 0;
  local_208.data._M_elems[3] = 0;
  local_208.data._M_elems[4] = 0;
  local_208.data._M_elems[5] = 0;
  local_208.data._M_elems._24_5_ = 0;
  local_208.data._M_elems[7]._1_3_ = 0;
  local_208.data._M_elems[8] = 0;
  local_208.data._M_elems[9] = 0;
  local_208.exp = 0;
  local_208.neg = false;
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems._24_5_ = 0;
  local_1b8.data._M_elems[7]._1_3_ = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  if (rn < 1) {
    local_1d0 = 0;
  }
  else {
    local_148 = (this->row).orig;
    local_138 = (this->row).perm;
    local_160 = (this->col).orig;
    local_170 = (this->u).col.idx;
    local_178 = (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_168 = (this->u).col.len;
    local_180 = (this->u).col.start;
    local_1d0 = 0;
    local_210 = ridx;
    local_1c0 = rhs;
    local_158 = vec;
    local_150 = vidx;
    local_140 = this;
    do {
      lVar18 = (long)*local_210;
      uVar20 = rn - 1;
      uVar21 = (ulong)uVar20;
      iVar8 = local_210[uVar21];
      iVar9 = 1;
      iVar10 = 0;
      if (3 < (uint)rn) {
        iVar10 = 0;
        do {
          iVar3 = local_210[iVar9];
          iVar17 = local_210[(long)iVar9 + 1];
          if (iVar17 < iVar3) {
            iVar12 = iVar9;
            iVar17 = iVar3;
            if (iVar3 <= iVar8) goto LAB_002ab6eb;
          }
          else {
            if (iVar17 <= iVar8) goto LAB_002ab6eb;
            iVar12 = iVar9 + 1;
          }
          local_210[iVar10] = iVar17;
          iVar9 = iVar12 * 2 + 1;
          iVar10 = iVar12;
        } while (iVar9 < (int)(rn - 2U));
      }
      if ((iVar9 < (int)uVar20) && (iVar8 < local_210[iVar9])) {
        local_210[iVar10] = local_210[iVar9];
        iVar10 = iVar9;
      }
LAB_002ab6eb:
      local_210[iVar10] = iVar8;
      pcVar14 = &local_1c0[local_148[lVar18]].m_backend;
      pcVar11 = &(local_140->diag).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_148[lVar18]].m_backend;
      local_248.fpclass = cpp_dec_float_finite;
      local_248.prec_elem = 10;
      local_248.data._M_elems[0] = 0;
      local_248.data._M_elems[1] = 0;
      local_248.data._M_elems[2] = 0;
      local_248.data._M_elems[3] = 0;
      local_248.data._M_elems[4] = 0;
      local_248.data._M_elems[5] = 0;
      local_248.data._M_elems._24_5_ = 0;
      local_248.data._M_elems[7]._1_3_ = 0;
      local_248.data._M_elems._32_5_ = 0;
      local_248.data._M_elems[9]._1_3_ = 0;
      local_248.exp = 0;
      local_248.neg = false;
      pcVar16 = pcVar11;
      if ((&local_248 != pcVar14) && (pcVar16 = pcVar14, &local_248 != pcVar11)) {
        uVar4 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
        local_248.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
        local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
        local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
        uVar4 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
        local_248.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_248.exp = pcVar11->exp;
        local_248.neg = pcVar11->neg;
        local_248.fpclass = pcVar11->fpclass;
        local_248.prec_elem = pcVar11->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_248,pcVar16)
      ;
      local_208.data._M_elems[0] = local_248.data._M_elems[0];
      local_208.data._M_elems[1] = local_248.data._M_elems[1];
      local_208.data._M_elems[2] = local_248.data._M_elems[2];
      local_208.data._M_elems[3] = local_248.data._M_elems[3];
      local_208.data._M_elems[4] = local_248.data._M_elems[4];
      local_208.data._M_elems[5] = local_248.data._M_elems[5];
      local_208.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
      local_208.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
      local_208.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
      local_208.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
      local_208.exp = local_248.exp;
      local_208.neg = local_248.neg;
      local_208.fpclass = local_248.fpclass;
      local_208.prec_elem = local_248.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(pcVar14,0);
      local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
      local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
      local_248.data._M_elems[4] = local_208.data._M_elems[4];
      local_248.data._M_elems[5] = local_208.data._M_elems[5];
      local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
      local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
      local_248.data._M_elems[2] = local_208.data._M_elems[2];
      local_248.data._M_elems[3] = local_208.data._M_elems[3];
      local_248.data._M_elems[0] = local_208.data._M_elems[0];
      local_248.data._M_elems[1] = local_208.data._M_elems[1];
      auVar7 = (undefined1  [16])local_248.data._M_elems._0_16_;
      local_68.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
      local_68.exp = (eps->m_backend).exp;
      local_68.neg = (eps->m_backend).neg;
      local_68.fpclass = (eps->m_backend).fpclass;
      local_68.prec_elem = (eps->m_backend).prec_elem;
      local_248.exp = local_208.exp;
      local_248.neg = local_208.neg;
      local_248.fpclass = local_208.fpclass;
      local_248.prec_elem = local_208.prec_elem;
      if ((local_208.neg == true) &&
         (local_248.data._M_elems[0] = local_208.data._M_elems[0],
         local_248.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite)) {
        local_248.neg = false;
      }
      rn = uVar20;
      if ((local_68.fpclass != cpp_dec_float_NaN && local_208.fpclass != cpp_dec_float_NaN) &&
         (local_248.data._M_elems._0_16_ = auVar7,
         iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_248,&local_68), 0 < iVar8)) {
        iVar8 = local_160[lVar18];
        local_150[(int)local_1d0] = iVar8;
        *(undefined8 *)(local_158[iVar8].m_backend.data._M_elems + 8) =
             local_208.data._M_elems._32_8_;
        puVar2 = local_158[iVar8].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_208.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
        *(undefined8 *)local_158[iVar8].m_backend.data._M_elems = local_208.data._M_elems._0_8_;
        *(undefined8 *)(local_158[iVar8].m_backend.data._M_elems + 2) =
             local_208.data._M_elems._8_8_;
        local_158[iVar8].m_backend.exp = local_208.exp;
        local_158[iVar8].m_backend.neg = local_208.neg;
        local_158[iVar8].m_backend.fpclass = local_208.fpclass;
        local_158[iVar8].m_backend.prec_elem = local_208.prec_elem;
        local_1c8 = uVar21;
        local_130 = lVar18;
        if (0 < local_168[iVar8]) {
          piVar19 = local_170 + local_180[iVar8];
          pcVar14 = &local_178[local_180[iVar8]].m_backend;
          iVar8 = local_168[iVar8];
          do {
            iVar10 = *piVar19;
            pnVar1 = local_1c0 + iVar10;
            local_1b8.data._M_elems._32_8_ =
                 *(undefined8 *)(local_1c0[iVar10].m_backend.data._M_elems + 8);
            local_1b8.data._M_elems._0_8_ = *(undefined8 *)local_1c0[iVar10].m_backend.data._M_elems
            ;
            local_1b8.data._M_elems._8_8_ =
                 *(undefined8 *)(local_1c0[iVar10].m_backend.data._M_elems + 2);
            puVar2 = local_1c0[iVar10].m_backend.data._M_elems + 4;
            local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar4 = *(undefined8 *)(puVar2 + 2);
            local_1b8.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_1b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_1b8.exp = local_1c0[iVar10].m_backend.exp;
            local_1b8.neg = local_1c0[iVar10].m_backend.neg;
            local_1b8.fpclass = local_1c0[iVar10].m_backend.fpclass;
            local_1b8.prec_elem = local_1c0[iVar10].m_backend.prec_elem;
            if (local_1b8.fpclass == cpp_dec_float_NaN) {
LAB_002ab9e0:
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 10;
              local_248.data._M_elems[0] = 0;
              local_248.data._M_elems[1] = 0;
              local_248.data._M_elems[2] = 0;
              local_248.data._M_elems[3] = 0;
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems._24_5_ = 0;
              local_248.data._M_elems[7]._1_3_ = 0;
              local_248.data._M_elems._32_5_ = 0;
              local_248.data._M_elems[9]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              pcVar16 = &local_208;
              if (&local_248 != pcVar14) {
                local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                local_248.data._M_elems[4] = local_208.data._M_elems[4];
                local_248.data._M_elems[5] = local_208.data._M_elems[5];
                local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                local_248.data._M_elems[0] = local_208.data._M_elems[0];
                local_248.data._M_elems[1] = local_208.data._M_elems[1];
                local_248.data._M_elems[2] = local_208.data._M_elems[2];
                local_248.data._M_elems[3] = local_208.data._M_elems[3];
                local_248.exp = local_208.exp;
                local_248.neg = local_208.neg;
                local_248.fpclass = local_208.fpclass;
                local_248.prec_elem = local_208.prec_elem;
                pcVar16 = pcVar14;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_248,pcVar16);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1b8,&local_248);
              a = 0.0;
              if (local_1b8.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_248,0,(type *)0x0);
                iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_1b8,&local_248);
                a = 0.0;
                if (iVar10 == 0) {
                  a = 1e-100;
                }
              }
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 10;
              local_248.data._M_elems._0_16_ = ZEXT816(0);
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems._24_5_ = 0;
              local_248.data._M_elems[7]._1_3_ = 0;
              local_248.data._M_elems._32_5_ = 0;
              local_248.data._M_elems[9]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248,a);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_1b8,&local_248);
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 8) =
                   local_1b8.data._M_elems._32_8_;
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                   local_1b8.data._M_elems._16_8_;
              *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                   CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
              *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_
              ;
              (pnVar1->m_backend).exp = local_1b8.exp;
              (pnVar1->m_backend).neg = local_1b8.neg;
              (pnVar1->m_backend).fpclass = local_1b8.fpclass;
              (pnVar1->m_backend).prec_elem = local_1b8.prec_elem;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_248,0,(type *)0x0);
              iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1b8,&local_248);
              if (iVar9 != 0) goto LAB_002ab9e0;
              local_128.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
              local_128.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
              local_128.data._M_elems[0] = local_208.data._M_elems[0];
              local_128.data._M_elems[1] = local_208.data._M_elems[1];
              uVar4 = local_128.data._M_elems._0_8_;
              local_128.data._M_elems[2] = local_208.data._M_elems[2];
              local_128.data._M_elems[3] = local_208.data._M_elems[3];
              local_128.data._M_elems[8] = local_208.data._M_elems[8];
              local_128.data._M_elems[9] = local_208.data._M_elems[9];
              local_128.data._M_elems[4] = local_208.data._M_elems[4];
              local_128.data._M_elems[5] = local_208.data._M_elems[5];
              local_128.exp = local_208.exp;
              local_128.fpclass = local_208.fpclass;
              local_128.prec_elem = local_208.prec_elem;
              local_128.data._M_elems[0] = local_208.data._M_elems[0];
              local_128.neg = local_208.neg;
              if (local_128.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite) {
                local_128.neg = (bool)(local_208.neg ^ 1);
              }
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 10;
              local_248.data._M_elems[0] = 0;
              local_248.data._M_elems[1] = 0;
              local_248.data._M_elems[2] = 0;
              local_248.data._M_elems[3] = 0;
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems._24_5_ = 0;
              local_248.data._M_elems[7]._1_3_ = 0;
              local_248.data._M_elems._32_5_ = 0;
              local_248.data._M_elems[9]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              pcVar16 = &local_128;
              if (&local_248 != pcVar14) {
                local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                local_248.data._M_elems[4] = local_208.data._M_elems[4];
                local_248.data._M_elems[5] = local_208.data._M_elems[5];
                local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                local_248.data._M_elems[0] = local_208.data._M_elems[0];
                local_248.data._M_elems[1] = local_208.data._M_elems[1];
                local_248.data._M_elems[2] = local_208.data._M_elems[2];
                local_248.data._M_elems[3] = local_208.data._M_elems[3];
                local_248.exp = local_208.exp;
                local_248.fpclass = local_208.fpclass;
                local_248.prec_elem = local_208.prec_elem;
                pcVar16 = pcVar14;
                local_248.neg = local_128.neg;
              }
              local_128.data._M_elems._0_8_ = uVar4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_248,pcVar16);
              local_1b8.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
              local_1b8.data._M_elems[4] = local_248.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_248.data._M_elems[5];
              local_1b8.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
              local_1b8.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems[0] = local_248.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_248.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_248.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_248.data._M_elems[3];
              local_1b8.exp = local_248.exp;
              local_1b8.neg = local_248.neg;
              local_1b8.prec_elem = local_248.prec_elem;
              local_1b8.fpclass = local_248.fpclass;
              auVar7 = (undefined1  [16])local_248.data._M_elems._0_16_;
              local_a8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
              local_a8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
              local_a8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
              local_a8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
              local_a8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
              local_a8.exp = (eps->m_backend).exp;
              local_a8.neg = (eps->m_backend).neg;
              local_a8.fpclass = (eps->m_backend).fpclass;
              local_a8.prec_elem = (eps->m_backend).prec_elem;
              if ((local_248.neg == true) &&
                 (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite)) {
                local_248.neg = false;
              }
              local_248.data._M_elems._0_16_ = auVar7;
              if ((local_a8.fpclass != cpp_dec_float_NaN && local_248.fpclass != cpp_dec_float_NaN)
                 && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_248,&local_a8), 0 < iVar9)) {
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 8) =
                     local_1b8.data._M_elems._32_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                     local_1b8.data._M_elems._16_8_;
                *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                     CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
                *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) =
                     local_1b8.data._M_elems._8_8_;
                (pnVar1->m_backend).exp = local_1b8.exp;
                (pnVar1->m_backend).neg = local_1b8.neg;
                (pnVar1->m_backend).fpclass = local_1b8.fpclass;
                (pnVar1->m_backend).prec_elem = local_1b8.prec_elem;
                iVar10 = local_138[iVar10];
                uVar13 = (uint)local_1c8;
                uVar20 = uVar13;
                if (0 < (int)uVar13) {
                  do {
                    uVar15 = (uint)local_1c8 - 1;
                    uVar6 = uVar15 >> 1;
                    uVar20 = (uint)local_1c8;
                    if (iVar10 <= local_210[uVar6]) break;
                    local_210[local_1c8 & 0xffffffff] = local_210[uVar6];
                    local_1c8 = (ulong)uVar6;
                    uVar20 = uVar6;
                  } while (1 < uVar15);
                }
                local_1c8 = (ulong)(uVar13 + 1);
                local_210[(int)uVar20] = iVar10;
              }
            }
            piVar19 = piVar19 + 1;
            pcVar14 = pcVar14 + 1;
            bVar5 = 1 < iVar8;
            iVar8 = iVar8 + -1;
          } while (bVar5);
        }
        rn = (int)local_1c8;
        local_1d0 = (ulong)((int)local_1d0 + 1);
        if ((double)(int)local_130 * 0.2 < (double)rn) {
          if (-1 < (long)*local_210) {
            lVar18 = (long)*local_210;
            do {
              pcVar14 = &local_1c0[local_148[lVar18]].m_backend;
              pcVar11 = &(local_140->diag).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_148[lVar18]].m_backend;
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 10;
              local_248.data._M_elems[0] = 0;
              local_248.data._M_elems[1] = 0;
              local_248.data._M_elems[2] = 0;
              local_248.data._M_elems[3] = 0;
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems._24_5_ = 0;
              local_248.data._M_elems[7]._1_3_ = 0;
              local_248.data._M_elems._32_5_ = 0;
              local_248.data._M_elems[9]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              pcVar16 = pcVar11;
              if ((&local_248 != pcVar14) && (pcVar16 = pcVar14, &local_248 != pcVar11)) {
                uVar4 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
                local_248.data._M_elems._32_5_ = SUB85(uVar4,0);
                local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
                local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
                local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
                local_248.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_248.exp = pcVar11->exp;
                local_248.neg = pcVar11->neg;
                local_248.fpclass = pcVar11->fpclass;
                local_248.prec_elem = pcVar11->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_248,pcVar16);
              local_208.data._M_elems[0] = local_248.data._M_elems[0];
              local_208.data._M_elems[1] = local_248.data._M_elems[1];
              local_208.data._M_elems[2] = local_248.data._M_elems[2];
              local_208.data._M_elems[3] = local_248.data._M_elems[3];
              local_208.data._M_elems[4] = local_248.data._M_elems[4];
              local_208.data._M_elems[5] = local_248.data._M_elems[5];
              local_208.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
              local_208.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
              local_208.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
              local_208.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
              local_208.exp = local_248.exp;
              local_208.neg = local_248.neg;
              local_208.fpclass = local_248.fpclass;
              local_208.prec_elem = local_248.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(pcVar14,0);
              local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
              local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
              local_248.data._M_elems[4] = local_208.data._M_elems[4];
              local_248.data._M_elems[5] = local_208.data._M_elems[5];
              local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
              local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
              local_248.data._M_elems[2] = local_208.data._M_elems[2];
              local_248.data._M_elems[3] = local_208.data._M_elems[3];
              local_248.data._M_elems[0] = local_208.data._M_elems[0];
              local_248.data._M_elems[1] = local_208.data._M_elems[1];
              auVar7 = (undefined1  [16])local_248.data._M_elems._0_16_;
              local_e8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
              local_e8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
              local_e8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
              local_e8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
              local_e8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
              local_e8.exp = (eps->m_backend).exp;
              local_e8.neg = (eps->m_backend).neg;
              local_e8.fpclass = (eps->m_backend).fpclass;
              local_e8.prec_elem = (eps->m_backend).prec_elem;
              local_248.exp = local_208.exp;
              local_248.neg = local_208.neg;
              local_248.fpclass = local_208.fpclass;
              local_248.prec_elem = local_208.prec_elem;
              if ((local_208.neg == true) &&
                 (local_248.data._M_elems[0] = local_208.data._M_elems[0],
                 local_248.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite)) {
                local_248.neg = false;
              }
              if ((local_e8.fpclass != cpp_dec_float_NaN && local_208.fpclass != cpp_dec_float_NaN)
                 && (local_248.data._M_elems._0_16_ = auVar7,
                    iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (&local_248,&local_e8), 0 < iVar8)) {
                iVar8 = local_160[lVar18];
                iVar10 = (int)local_1d0;
                local_1d0 = (ulong)(iVar10 + 1);
                local_150[iVar10] = iVar8;
                *(undefined8 *)(local_158[iVar8].m_backend.data._M_elems + 8) =
                     local_208.data._M_elems._32_8_;
                puVar2 = local_158[iVar8].m_backend.data._M_elems + 4;
                *(undefined8 *)puVar2 = local_208.data._M_elems._16_8_;
                *(ulong *)(puVar2 + 2) =
                     CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
                *(undefined8 *)local_158[iVar8].m_backend.data._M_elems =
                     local_208.data._M_elems._0_8_;
                *(undefined8 *)(local_158[iVar8].m_backend.data._M_elems + 2) =
                     local_208.data._M_elems._8_8_;
                local_158[iVar8].m_backend.exp = local_208.exp;
                local_158[iVar8].m_backend.neg = local_208.neg;
                local_158[iVar8].m_backend.fpclass = local_208.fpclass;
                local_158[iVar8].m_backend.prec_elem = local_208.prec_elem;
                if (0 < local_168[iVar8]) {
                  piVar19 = local_170 + local_180[iVar8];
                  pcVar14 = &local_178[local_180[iVar8]].m_backend;
                  uVar20 = local_168[iVar8] + 1;
                  do {
                    local_248.fpclass = cpp_dec_float_finite;
                    local_248.prec_elem = 10;
                    local_248.data._M_elems[0] = 0;
                    local_248.data._M_elems[1] = 0;
                    local_248.data._M_elems[2] = 0;
                    local_248.data._M_elems[3] = 0;
                    local_248.data._M_elems[4] = 0;
                    local_248.data._M_elems[5] = 0;
                    local_248.data._M_elems._24_5_ = 0;
                    local_248.data._M_elems[7]._1_3_ = 0;
                    local_248.data._M_elems._32_5_ = 0;
                    local_248.data._M_elems[9]._1_3_ = 0;
                    local_248.exp = 0;
                    local_248.neg = false;
                    pcVar16 = &local_208;
                    if (pcVar14 != &local_248) {
                      local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                      local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                      local_248.data._M_elems[4] = local_208.data._M_elems[4];
                      local_248.data._M_elems[5] = local_208.data._M_elems[5];
                      local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                      local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                      local_248.data._M_elems[2] = local_208.data._M_elems[2];
                      local_248.data._M_elems[3] = local_208.data._M_elems[3];
                      local_248.data._M_elems[0] = local_208.data._M_elems[0];
                      local_248.data._M_elems[1] = local_208.data._M_elems[1];
                      local_248.exp = local_208.exp;
                      local_248.neg = local_208.neg;
                      local_248.fpclass = local_208.fpclass;
                      local_248.prec_elem = local_208.prec_elem;
                      pcVar16 = pcVar14;
                    }
                    pcVar14 = pcVar14 + 1;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                              (&local_248,pcVar16);
                    iVar8 = *piVar19;
                    piVar19 = piVar19 + 1;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&local_1c0[iVar8].m_backend,&local_248);
                    uVar20 = uVar20 - 1;
                  } while (1 < uVar20);
                }
              }
              bVar5 = 0 < lVar18;
              lVar18 = lVar18 + -1;
            } while (bVar5);
          }
          break;
        }
      }
    } while (0 < rn);
  }
  return (int)local_1d0;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}